

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O1

type Disa::operator*(Matrix_Dense<double,_2UL,_2UL> *matrix,Vector_Dense<double,_2UL> *vector)

{
  array<double,_2UL> local_38;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  pcStack_10 = std::
               _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_dense.hpp:463:25)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_dense.hpp:463:25)>
             ::_M_manager;
  local_28._M_unused._M_object = matrix;
  local_28._8_8_ = vector;
  Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)&local_38,(function<double_(unsigned_long)> *)&local_28,2)
  ;
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return (array<double,_2UL>)(array<double,_2UL>)local_38._M_elems;
}

Assistant:

Matrix_Dense() : std::vector<Vector_Dense<_type, 0>>(){}